

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O0

If_Grp_t * If_CluDecUsingCofs(If_Grp_t *__return_storage_ptr__,word *pTruth,int nVars,int nLutLeaf)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iPlace1;
  int iPlace0;
  int State;
  int iVar;
  int k;
  int i;
  int v;
  int nVarsNeeded;
  int P2V [18];
  int local_2108 [2];
  int V2P [18];
  uint auStack_20b8 [2];
  int Pla2Var [18];
  int aiStack_2068 [2];
  int Var2Pla [18];
  word *pF;
  word pF2 [1024];
  int nLutLeaf_local;
  int nVars_local;
  word *pTruth_local;
  
  pF2[0x3ff]._0_4_ = nLutLeaf;
  pF2[0x3ff]._4_4_ = nVars;
  memset(__return_storage_ptr__,0,0x12);
  Var2Pla._64_8_ = &pF;
  iVar2 = pF2[0x3ff]._4_4_ - (int)pF2[0x3ff];
  If_CluCopy((word *)Var2Pla._64_8_,pTruth,pF2[0x3ff]._4_4_);
  for (State = 0; State < pF2[0x3ff]._4_4_; State = State + 1) {
    auStack_20b8[State] = State;
    aiStack_2068[State] = State;
  }
  iVar = 0;
  do {
    k = pF2[0x3ff]._4_4_;
    if (iVar2 <= iVar) {
      __return_storage_ptr__->nVars = (char)(int)pF2[0x3ff];
      __return_storage_ptr__->nMyu = '\x02';
      for (k = 0; k < __return_storage_ptr__->nVars; k = k + 1) {
        __return_storage_ptr__->pVars[k] = (char)auStack_20b8[k];
      }
      return __return_storage_ptr__;
    }
    do {
      k = k + -1;
      if (k < 0) goto LAB_004d2e24;
      iVar3 = If_CluDetectSpecialCaseCofs((word *)Var2Pla._64_8_,pF2[0x3ff]._4_4_,k);
    } while (iVar3 == -1);
    uVar1 = auStack_20b8[k];
    while (aiStack_2068[(int)uVar1] < pF2[0x3ff]._4_4_ + -1) {
      iVar5 = aiStack_2068[(int)uVar1];
      iVar4 = aiStack_2068[(int)uVar1] + 1;
      aiStack_2068[(int)auStack_20b8[iVar5]] = aiStack_2068[(int)auStack_20b8[iVar5]] + 1;
      aiStack_2068[(int)auStack_20b8[iVar4]] = aiStack_2068[(int)auStack_20b8[iVar4]] + -1;
      auStack_20b8[iVar5] = auStack_20b8[iVar4] ^ auStack_20b8[iVar5];
      auStack_20b8[iVar4] = auStack_20b8[iVar5] ^ auStack_20b8[iVar4];
      auStack_20b8[iVar5] = auStack_20b8[iVar4] ^ auStack_20b8[iVar5];
    }
    for (State = 0; State < pF2[0x3ff]._4_4_; State = State + 1) {
      (&v)[State] = State;
      local_2108[State] = State;
    }
    If_CluMoveVar((word *)Var2Pla._64_8_,pF2[0x3ff]._4_4_,local_2108,&v,k,pF2[0x3ff]._4_4_ + -1);
    iVar5 = pF2[0x3ff]._4_4_ + -1;
    if ((iVar3 == 0) || (iVar3 == 1)) {
      if (iVar5 < 6) {
        *(ulong *)Var2Pla._64_8_ =
             *(ulong *)Var2Pla._64_8_ & Truth6[iVar5] |
             (*(ulong *)Var2Pla._64_8_ & Truth6[iVar5]) >>
             ((byte)(1 << ((byte)iVar5 & 0x1f)) & 0x3f);
      }
      else {
        iVar3 = If_CluWordNum(pF2[0x3ff]._4_4_);
        Var2Pla._64_8_ = Var2Pla._64_8_ + (long)(iVar3 / 2) * 8;
      }
    }
    else if (iVar5 < 6) {
      *(ulong *)Var2Pla._64_8_ =
           *(ulong *)Var2Pla._64_8_ & (Truth6[iVar5] ^ 0xffffffffffffffff) |
           (*(ulong *)Var2Pla._64_8_ & (Truth6[iVar5] ^ 0xffffffffffffffff)) <<
           ((byte)(1 << ((byte)iVar5 & 0x1f)) & 0x3f);
    }
    pF2[0x3ff]._4_4_ = pF2[0x3ff]._4_4_ + -1;
LAB_004d2e24:
    if (k == -1) {
      return __return_storage_ptr__;
    }
    iVar = iVar + 1;
  } while( true );
}

Assistant:

If_Grp_t If_CluDecUsingCofs( word * pTruth, int nVars, int nLutLeaf )
{
    If_Grp_t G = {0};
    word pF2[CLU_WRD_MAX], * pF = pF2;
    int Var2Pla[CLU_VAR_MAX+2], Pla2Var[CLU_VAR_MAX+2];
    int V2P[CLU_VAR_MAX+2], P2V[CLU_VAR_MAX+2];
    int nVarsNeeded = nVars - nLutLeaf;
    int v, i, k, iVar, State;
//Kit_DsdPrintFromTruth( (unsigned*)pTruth, nVars ); printf( "\n" );
    // create local copy
    If_CluCopy( pF, pTruth, nVars );
    for ( k = 0; k < nVars; k++ )
        Var2Pla[k] = Pla2Var[k] = k;
    // find decomposable vars 
    for ( i = 0; i < nVarsNeeded; i++ )
    {
        for ( v = nVars - 1; v >= 0; v-- )
        {
            State = If_CluDetectSpecialCaseCofs( pF, nVars, v );
            if ( State == -1 )
                continue;
            // update the variable place
            iVar = Pla2Var[v];
            while ( Var2Pla[iVar] < nVars - 1 )
            {
                int iPlace0 = Var2Pla[iVar];
                int iPlace1 = Var2Pla[iVar]+1;
                Var2Pla[Pla2Var[iPlace0]]++;
                Var2Pla[Pla2Var[iPlace1]]--;
                Pla2Var[iPlace0] ^= Pla2Var[iPlace1];
                Pla2Var[iPlace1] ^= Pla2Var[iPlace0];
                Pla2Var[iPlace0] ^= Pla2Var[iPlace1];
            }
            // move this variable to the top
            for ( k = 0; k < nVars; k++ )
                V2P[k] = P2V[k] = k;
//Kit_DsdPrintFromTruth( (unsigned*)pF, nVars ); printf( "\n" );
            If_CluMoveVar( pF, nVars, V2P, P2V, v, nVars - 1 );
//Kit_DsdPrintFromTruth( (unsigned*)pF, nVars ); printf( "\n" );
            // choose cofactor to follow
            iVar = nVars - 1;
            if ( State == 0 || State == 1 ) // need cof1
            {
                if ( iVar < 6 )
                    pF[0] = (pF[0] &  Truth6[iVar]) | ((pF[0] &  Truth6[iVar]) >> (1 << iVar));
                else
                    pF += If_CluWordNum( nVars ) / 2;
            }
            else // need cof0
            {
                if ( iVar < 6 )
                    pF[0] = (pF[0] & ~Truth6[iVar]) | ((pF[0] & ~Truth6[iVar]) << (1 << iVar));
            }
            // update the variable count
            nVars--;
            break;
        }
        if ( v == -1 )
            return G;
    }
    // create the resulting group
    G.nVars = nLutLeaf;
    G.nMyu = 2;
    for ( v = 0; v < G.nVars; v++ )
        G.pVars[v] = Pla2Var[v];
    return G;
}